

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressStream_generic
                 (ZSTD_CStream *zcs,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective flushMode)

{
  ZSTD_cStreamStage ZVar1;
  char *pcVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  size_t local_140;
  size_t local_138;
  bool local_129;
  size_t local_120;
  size_t local_118;
  void *local_100;
  void *local_f8;
  char *local_f0;
  char *local_e8;
  size_t flushed;
  size_t toFlush;
  size_t err_code_2;
  uint lastBlock_1;
  size_t err_code_1;
  uint lastBlock;
  size_t iSize;
  size_t oSize;
  size_t cSize_1;
  void *cDst;
  int inputBuffered;
  size_t loaded;
  size_t toLoad;
  size_t err_code;
  size_t cSize;
  void *pvStack_60;
  U32 someMoreWork;
  char *op;
  char *oend;
  char *ostart;
  char *ip;
  char *iend;
  char *istart;
  ZSTD_EndDirective flushMode_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CStream *zcs_local;
  
  pcVar2 = (char *)input->src;
  local_e8 = pcVar2;
  if (input->size != 0) {
    local_e8 = pcVar2 + input->size;
  }
  local_f0 = pcVar2;
  if (input->pos != 0) {
    local_f0 = pcVar2 + input->pos;
  }
  ostart = local_f0;
  pvVar3 = output->dst;
  local_f8 = pvVar3;
  if (output->size != 0) {
    local_f8 = (void *)((long)pvVar3 + output->size);
  }
  local_100 = pvVar3;
  if (output->pos != 0) {
    local_100 = (void *)((long)pvVar3 + output->pos);
  }
  pvStack_60 = local_100;
  bVar4 = true;
LAB_00a4ec7f:
  while( true ) {
    if (!bVar4) {
      input->pos = (long)ostart - (long)pcVar2;
      output->pos = (long)pvStack_60 - (long)pvVar3;
      if (zcs->frameEnded == 0) {
        zcs_local = (ZSTD_CStream *)ZSTD_nextInputSizeHint(zcs);
      }
      else {
        zcs_local = (ZSTD_CStream *)0x0;
      }
      return (size_t)zcs_local;
    }
    ZVar1 = zcs->streamStage;
    if (ZVar1 == zcss_init) {
      return 0xffffffffffffffc2;
    }
    if (ZVar1 != zcss_load) goto LAB_00a4ecac;
    if ((flushMode != ZSTD_e_end) ||
       (((sVar7 = ZSTD_compressBound((long)local_e8 - (long)ostart),
         (ulong)((long)local_f8 - (long)pvStack_60) < sVar7 &&
         ((zcs->appliedParams).outBufferMode != ZSTD_bm_stable)) || (zcs->inBuffPos != 0)))) break;
    sVar7 = ZSTD_compressEnd(zcs,pvStack_60,(long)local_f8 - (long)pvStack_60,ostart,
                             (long)local_e8 - (long)ostart);
    uVar5 = ERR_isError(sVar7);
    if (uVar5 != 0) {
      return sVar7;
    }
    ostart = local_e8;
    pvStack_60 = (void *)(sVar7 + (long)pvStack_60);
    zcs->frameEnded = 1;
    ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
    bVar4 = false;
  }
  if ((zcs->appliedParams).inBufferMode == ZSTD_bm_buffered) {
    sVar7 = ZSTD_limitCopy(zcs->inBuff + zcs->inBuffPos,zcs->inBuffTarget - zcs->inBuffPos,ostart,
                           (long)local_e8 - (long)ostart);
    zcs->inBuffPos = sVar7 + zcs->inBuffPos;
    if (sVar7 != 0) {
      ostart = ostart + sVar7;
    }
    if ((flushMode == ZSTD_e_continue) && (zcs->inBuffPos < zcs->inBuffTarget)) {
      bVar4 = false;
      goto LAB_00a4ec7f;
    }
    if ((flushMode == ZSTD_e_flush) && (zcs->inBuffPos == zcs->inToCompress)) {
      bVar4 = false;
      goto LAB_00a4ec7f;
    }
  }
  bVar9 = (zcs->appliedParams).inBufferMode != ZSTD_bm_buffered;
  iSize = (long)local_f8 - (long)pvStack_60;
  if (bVar9) {
    if ((ulong)((long)local_e8 - (long)ostart) < zcs->blockSize) {
      local_120 = (long)local_e8 - (long)ostart;
    }
    else {
      local_120 = zcs->blockSize;
    }
    local_118 = local_120;
  }
  else {
    local_118 = zcs->inBuffPos - zcs->inToCompress;
  }
  sVar7 = ZSTD_compressBound(local_118);
  if ((iSize < sVar7) && ((zcs->appliedParams).outBufferMode != ZSTD_bm_stable)) {
    cSize_1 = (size_t)zcs->outBuff;
    iSize = zcs->outBuffSize;
  }
  else {
    cSize_1 = (size_t)pvStack_60;
  }
  if (bVar9) {
    pcVar6 = ostart + local_118;
    if ((pcVar6 == local_e8) == 0) {
      local_140 = ZSTD_compressContinue(zcs,(void *)cSize_1,iSize,ostart,local_118);
    }
    else {
      local_140 = ZSTD_compressEnd(zcs,(void *)cSize_1,iSize,ostart,local_118);
    }
    oSize = local_140;
    if (local_118 != 0) {
      ostart = ostart + local_118;
    }
    uVar5 = ERR_isError(local_140);
    if (uVar5 != 0) {
      return local_140;
    }
    zcs->frameEnded = (uint)(pcVar6 == local_e8);
  }
  else {
    local_129 = flushMode == ZSTD_e_end && ostart == local_e8;
    if (local_129 == 0) {
      local_138 = ZSTD_compressContinue
                            (zcs,(void *)cSize_1,iSize,zcs->inBuff + zcs->inToCompress,local_118);
    }
    else {
      local_138 = ZSTD_compressEnd(zcs,(void *)cSize_1,iSize,zcs->inBuff + zcs->inToCompress,
                                   local_118);
    }
    oSize = local_138;
    uVar5 = ERR_isError(local_138);
    if (uVar5 != 0) {
      return local_138;
    }
    zcs->frameEnded = (uint)local_129;
    zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
    if (zcs->inBuffSize < zcs->inBuffTarget) {
      zcs->inBuffPos = 0;
      zcs->inBuffTarget = zcs->blockSize;
    }
    zcs->inToCompress = zcs->inBuffPos;
  }
  if ((void *)cSize_1 != pvStack_60) {
    zcs->outBuffContentSize = oSize;
    zcs->outBuffFlushedSize = 0;
    zcs->streamStage = zcss_flush;
    goto LAB_00a4f29d;
  }
  pvStack_60 = (void *)(oSize + (long)pvStack_60);
  if (zcs->frameEnded != 0) {
    bVar4 = false;
    ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  }
  goto LAB_00a4ec7f;
LAB_00a4ecac:
  if (ZVar1 == zcss_flush) {
LAB_00a4f29d:
    sVar7 = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
    sVar8 = ZSTD_limitCopy(pvStack_60,(long)local_f8 - (long)pvStack_60,
                           zcs->outBuff + zcs->outBuffFlushedSize,sVar7);
    if (sVar8 != 0) {
      pvStack_60 = (void *)(sVar8 + (long)pvStack_60);
    }
    zcs->outBuffFlushedSize = sVar8 + zcs->outBuffFlushedSize;
    if (sVar7 == sVar8) {
      zcs->outBuffFlushedSize = 0;
      zcs->outBuffContentSize = 0;
      if (zcs->frameEnded == 0) {
        zcs->streamStage = zcss_load;
      }
      else {
        bVar4 = false;
        ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
      }
    }
    else {
      bVar4 = false;
    }
  }
  goto LAB_00a4ec7f;
}

Assistant:

static size_t ZSTD_compressStream_generic(ZSTD_CStream* zcs,
                                          ZSTD_outBuffer* output,
                                          ZSTD_inBuffer* input,
                                          ZSTD_EndDirective const flushMode)
{
    const char* const istart = (const char*)input->src;
    const char* const iend = input->size != 0 ? istart + input->size : istart;
    const char* ip = input->pos != 0 ? istart + input->pos : istart;
    char* const ostart = (char*)output->dst;
    char* const oend = output->size != 0 ? ostart + output->size : ostart;
    char* op = output->pos != 0 ? ostart + output->pos : ostart;
    U32 someMoreWork = 1;

    /* check expectations */
    DEBUGLOG(5, "ZSTD_compressStream_generic, flush=%u", (unsigned)flushMode);
    if (zcs->appliedParams.inBufferMode == ZSTD_bm_buffered) {
        assert(zcs->inBuff != NULL);
        assert(zcs->inBuffSize > 0);
    }
    if (zcs->appliedParams.outBufferMode == ZSTD_bm_buffered) {
        assert(zcs->outBuff !=  NULL);
        assert(zcs->outBuffSize > 0);
    }
    assert(output->pos <= output->size);
    assert(input->pos <= input->size);
    assert((U32)flushMode <= (U32)ZSTD_e_end);

    while (someMoreWork) {
        switch(zcs->streamStage)
        {
        case zcss_init:
            RETURN_ERROR(init_missing, "call ZSTD_initCStream() first!");

        case zcss_load:
            if ( (flushMode == ZSTD_e_end)
              && ( (size_t)(oend-op) >= ZSTD_compressBound(iend-ip)     /* Enough output space */
                || zcs->appliedParams.outBufferMode == ZSTD_bm_stable)  /* OR we are allowed to return dstSizeTooSmall */
              && (zcs->inBuffPos == 0) ) {
                /* shortcut to compression pass directly into output buffer */
                size_t const cSize = ZSTD_compressEnd(zcs,
                                                op, oend-op, ip, iend-ip);
                DEBUGLOG(4, "ZSTD_compressEnd : cSize=%u", (unsigned)cSize);
                FORWARD_IF_ERROR(cSize, "ZSTD_compressEnd failed");
                ip = iend;
                op += cSize;
                zcs->frameEnded = 1;
                ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                someMoreWork = 0; break;
            }
            /* complete loading into inBuffer in buffered mode */
            if (zcs->appliedParams.inBufferMode == ZSTD_bm_buffered) {
                size_t const toLoad = zcs->inBuffTarget - zcs->inBuffPos;
                size_t const loaded = ZSTD_limitCopy(
                                        zcs->inBuff + zcs->inBuffPos, toLoad,
                                        ip, iend-ip);
                zcs->inBuffPos += loaded;
                if (loaded != 0)
                    ip += loaded;
                if ( (flushMode == ZSTD_e_continue)
                  && (zcs->inBuffPos < zcs->inBuffTarget) ) {
                    /* not enough input to fill full block : stop here */
                    someMoreWork = 0; break;
                }
                if ( (flushMode == ZSTD_e_flush)
                  && (zcs->inBuffPos == zcs->inToCompress) ) {
                    /* empty */
                    someMoreWork = 0; break;
                }
            }
            /* compress current block (note : this stage cannot be stopped in the middle) */
            DEBUGLOG(5, "stream compression stage (flushMode==%u)", flushMode);
            {   int const inputBuffered = (zcs->appliedParams.inBufferMode == ZSTD_bm_buffered);
                void* cDst;
                size_t cSize;
                size_t oSize = oend-op;
                size_t const iSize = inputBuffered
                    ? zcs->inBuffPos - zcs->inToCompress
                    : MIN((size_t)(iend - ip), zcs->blockSize);
                if (oSize >= ZSTD_compressBound(iSize) || zcs->appliedParams.outBufferMode == ZSTD_bm_stable)
                    cDst = op;   /* compress into output buffer, to skip flush stage */
                else
                    cDst = zcs->outBuff, oSize = zcs->outBuffSize;
                if (inputBuffered) {
                    unsigned const lastBlock = (flushMode == ZSTD_e_end) && (ip==iend);
                    cSize = lastBlock ?
                            ZSTD_compressEnd(zcs, cDst, oSize,
                                        zcs->inBuff + zcs->inToCompress, iSize) :
                            ZSTD_compressContinue(zcs, cDst, oSize,
                                        zcs->inBuff + zcs->inToCompress, iSize);
                    FORWARD_IF_ERROR(cSize, "%s", lastBlock ? "ZSTD_compressEnd failed" : "ZSTD_compressContinue failed");
                    zcs->frameEnded = lastBlock;
                    /* prepare next block */
                    zcs->inBuffTarget = zcs->inBuffPos + zcs->blockSize;
                    if (zcs->inBuffTarget > zcs->inBuffSize)
                        zcs->inBuffPos = 0, zcs->inBuffTarget = zcs->blockSize;
                    DEBUGLOG(5, "inBuffTarget:%u / inBuffSize:%u",
                            (unsigned)zcs->inBuffTarget, (unsigned)zcs->inBuffSize);
                    if (!lastBlock)
                        assert(zcs->inBuffTarget <= zcs->inBuffSize);
                    zcs->inToCompress = zcs->inBuffPos;
                } else {
                    unsigned const lastBlock = (ip + iSize == iend);
                    assert(flushMode == ZSTD_e_end /* Already validated */);
                    cSize = lastBlock ?
                            ZSTD_compressEnd(zcs, cDst, oSize, ip, iSize) :
                            ZSTD_compressContinue(zcs, cDst, oSize, ip, iSize);
                    /* Consume the input prior to error checking to mirror buffered mode. */
                    if (iSize > 0)
                        ip += iSize;
                    FORWARD_IF_ERROR(cSize, "%s", lastBlock ? "ZSTD_compressEnd failed" : "ZSTD_compressContinue failed");
                    zcs->frameEnded = lastBlock;
                    if (lastBlock)
                        assert(ip == iend);
                }
                if (cDst == op) {  /* no need to flush */
                    op += cSize;
                    if (zcs->frameEnded) {
                        DEBUGLOG(5, "Frame completed directly in outBuffer");
                        someMoreWork = 0;
                        ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    }
                    break;
                }
                zcs->outBuffContentSize = cSize;
                zcs->outBuffFlushedSize = 0;
                zcs->streamStage = zcss_flush; /* pass-through to flush stage */
            }
	    /* fall-through */
        case zcss_flush:
            DEBUGLOG(5, "flush stage");
            assert(zcs->appliedParams.outBufferMode == ZSTD_bm_buffered);
            {   size_t const toFlush = zcs->outBuffContentSize - zcs->outBuffFlushedSize;
                size_t const flushed = ZSTD_limitCopy(op, (size_t)(oend-op),
                            zcs->outBuff + zcs->outBuffFlushedSize, toFlush);
                DEBUGLOG(5, "toFlush: %u into %u ==> flushed: %u",
                            (unsigned)toFlush, (unsigned)(oend-op), (unsigned)flushed);
                if (flushed)
                    op += flushed;
                zcs->outBuffFlushedSize += flushed;
                if (toFlush!=flushed) {
                    /* flush not fully completed, presumably because dst is too small */
                    assert(op==oend);
                    someMoreWork = 0;
                    break;
                }
                zcs->outBuffContentSize = zcs->outBuffFlushedSize = 0;
                if (zcs->frameEnded) {
                    DEBUGLOG(5, "Frame completed on flush");
                    someMoreWork = 0;
                    ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only);
                    break;
                }
                zcs->streamStage = zcss_load;
                break;
            }

        default: /* impossible */
            assert(0);
        }
    }

    input->pos = ip - istart;
    output->pos = op - ostart;
    if (zcs->frameEnded) return 0;
    return ZSTD_nextInputSizeHint(zcs);
}